

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_unary.h
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
lf::mesh::utils::internal::UnaryOpSquaredNorm::operator()
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,UnaryOpSquaredNorm *this,
          vector<double,_std::allocator<double>_> *u,int param_2)

{
  PointerType dataPtr;
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  variable_if_dynamic<long,__1> vVar4;
  long lVar5;
  ulong uVar6;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> rm;
  Map<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> um;
  assign_op<double,_double> local_a9;
  vector<double,_std::allocator<double>_> local_a8;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> local_88;
  MapBase<Eigen::Map<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  local_68;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  local_48;
  
  dataPtr = (u->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
            ._M_start;
  Eigen::
  MapBase<Eigen::Map<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>::
  MapBase(&local_68,dataPtr,1,
          (long)(u->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)dataPtr >> 3);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_a8,
             (long)(u->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(u->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_48);
  Eigen::MapBase<Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>::
  MapBase((MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0> *
          )&local_88,
          local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start,1,
          (long)(u->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(u->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3);
  local_48.m_xpr.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  .m_cols.m_value = local_68.m_cols.m_value;
  local_48.m_xpr.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  .m_data = local_68.m_data;
  local_48.m_xpr.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  ._8_8_ = local_68._8_8_;
  Eigen::internal::
  resize_if_allowed<Eigen::Map<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::Stride<0,0>>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Map<Eigen::Matrix<double,1,_1,1,1,_1>const,0,Eigen::Stride<0,0>>const>,double,double>
            (&local_88,&local_48,&local_a9);
  vVar4.m_value =
       local_88.
       super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_cols.m_value;
  if ((((ulong)local_88.
               super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_data & 7) == 0) &&
     (vVar4.m_value =
           (long)((uint)((ulong)local_88.
                                super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                .
                                super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                .m_data >> 3) & 1),
     local_88.
     super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
     super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
     m_cols.m_value <= vVar4.m_value)) {
    vVar4.m_value =
         local_88.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value;
  }
  lVar5 = local_88.
          super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value - vVar4.m_value;
  if (0 < vVar4.m_value) {
    uVar6 = 0;
    do {
      local_88.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
      m_data[uVar6] = local_68.m_data[uVar6] * local_68.m_data[uVar6];
      uVar6 = uVar6 + 1;
    } while (vVar4.m_value != uVar6);
  }
  uVar6 = (lVar5 - (lVar5 >> 0x3f) & 0xfffffffffffffffeU) + vVar4.m_value;
  if (1 < lVar5) {
    do {
      dVar3 = local_68.m_data[vVar4.m_value];
      dVar2 = (local_68.m_data + vVar4.m_value)[1];
      dVar2 = dVar2 * dVar2;
      auVar1._8_4_ = SUB84(dVar2,0);
      auVar1._0_8_ = dVar3 * dVar3;
      auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
      *(undefined1 (*) [16])
       (local_88.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data + vVar4.m_value) = auVar1;
      vVar4.m_value = vVar4.m_value + 2;
    } while (vVar4.m_value < (long)uVar6);
  }
  if ((long)uVar6 <
      local_88.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
      m_cols.m_value) {
    do {
      local_88.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
      m_data[uVar6] = local_68.m_data[uVar6] * local_68.m_data[uVar6];
      uVar6 = uVar6 + 1;
    } while (local_88.
             super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_cols.m_value != uVar6);
  }
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start =
       local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  return __return_storage_ptr__;
}

Assistant:

auto operator()(const std::vector<U>& u, int /*unused*/) const {
    const Eigen::Map<const Eigen::Matrix<U, 1, Eigen::Dynamic>> um(u.data(), 1,
                                                                   u.size());
    std::vector<U> result(u.size());
    Eigen::Map<Eigen::Matrix<U, 1, Eigen::Dynamic>> rm(result.data(), 1,
                                                       u.size());
    rm = um.cwiseAbs2();
    return result;
  }